

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxx_string_field.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::cxx::StringFieldGenerator::GenerateClearingCode
          (StringFieldGenerator *this,Printer *printer)

{
  char *text;
  
  text = "if ($name$_ != $default_variable$) {\n  $name$_->assign(*$default_variable$);\n}\n";
  if (*(long *)(*(long *)(this->descriptor_ + 0x70) + 8) == 0) {
    text = "if ($name$_ != $default_variable$) {\n  $name$_->clear();\n}\n";
  }
  io::Printer::Print(printer,&this->variables_,text);
  return;
}

Assistant:

void StringFieldGenerator::
GenerateClearingCode(io::Printer* printer) const {
  if (descriptor_->default_value_string().empty()) {
    printer->Print(variables_,
      "if ($name$_ != $default_variable$) {\n"
      "  $name$_->clear();\n"
      "}\n");
  } else {
    printer->Print(variables_,
      "if ($name$_ != $default_variable$) {\n"
      "  $name$_->assign(*$default_variable$);\n"
      "}\n");
  }
}